

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_bind_protocol(lws *wsi,lws_protocols *p,char *reason)

{
  lws_protocols *plVar1;
  bool bVar2;
  int iVar3;
  int local_3c;
  int hit;
  int n;
  lws_protocols *vpo;
  lws_protocols *vp;
  char *reason_local;
  lws_protocols *p_local;
  lws *wsi_local;
  
  plVar1 = wsi->vhost->protocols;
  if ((wsi->protocol != (lws_protocols *)0x0) && ((*(ulong *)&wsi->field_0x2dc >> 0x22 & 1) != 0)) {
    (*wsi->protocol->callback)
              (wsi,(uint)wsi->role_ops->protocol_unbind_cb
                         [(int)(uint)((wsi->wsistate & 0x20000000) != 0)],wsi->user_space,reason,0);
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffbffffffff;
  }
  if ((*(ulong *)&wsi->field_0x2dc >> 0xb & 1) == 0) {
    lws_realloc(wsi->user_space,0,"free");
    wsi->user_space = (void *)0x0;
  }
  lws_same_vh_protocol_remove(wsi);
  wsi->protocol = p;
  if (p == (lws_protocols *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    iVar3 = lws_ensure_user_space(wsi);
    if (iVar3 == 0) {
      if ((plVar1 < p) && (p < plVar1 + wsi->vhost->count_protocols)) {
        lws_same_vh_protocol_insert(wsi,(int)(((long)p - (long)plVar1) / 0x38));
      }
      else {
        bVar2 = false;
        local_3c = wsi->vhost->count_protocols;
        vpo = plVar1;
        while (local_3c != 0) {
          if (((p->name != (char *)0x0) && (vpo->name != (char *)0x0)) &&
             (iVar3 = strcmp(p->name,vpo->name), iVar3 == 0)) {
            bVar2 = true;
            lws_same_vh_protocol_insert(wsi,(int)(((long)vpo - (long)plVar1) / 0x38));
            break;
          }
          vpo = vpo + 1;
          local_3c = local_3c + -1;
        }
        if (!bVar2) {
          _lws_log(1,"%s: %p is not in vhost \'%s\' protocols list\n","lws_bind_protocol",p,
                   wsi->vhost->name);
        }
      }
      iVar3 = (*wsi->protocol->callback)
                        (wsi,(uint)wsi->role_ops->protocol_bind_cb
                                   [(int)(uint)((wsi->wsistate & 0x20000000) != 0)],wsi->user_space,
                         (void *)0x0,0);
      if (iVar3 == 0) {
        *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffbffffffff | 0x400000000
        ;
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_bind_protocol(struct lws *wsi, const struct lws_protocols *p,
		  const char *reason)
{
//	if (wsi->protocol == p)
//		return 0;
	const struct lws_protocols *vp = wsi->vhost->protocols, *vpo;

	if (wsi->protocol && wsi->protocol_bind_balance) {
		wsi->protocol->callback(wsi,
		       wsi->role_ops->protocol_unbind_cb[!!lwsi_role_server(wsi)],
					wsi->user_space, (void *)reason, 0);
		wsi->protocol_bind_balance = 0;
	}
	if (!wsi->user_space_externally_allocated)
		lws_free_set_NULL(wsi->user_space);

	lws_same_vh_protocol_remove(wsi);

	wsi->protocol = p;
	if (!p)
		return 0;

	if (lws_ensure_user_space(wsi))
		return 1;

	if (p > vp && p < &vp[wsi->vhost->count_protocols])
		lws_same_vh_protocol_insert(wsi, (int)(p - vp));
	else {
		int n = wsi->vhost->count_protocols;
		int hit = 0;

		vpo = vp;

		while (n--) {
			if (p->name && vp->name && !strcmp(p->name, vp->name)) {
				hit = 1;
				lws_same_vh_protocol_insert(wsi, (int)(vp - vpo));
				break;
			}
			vp++;
		}
		if (!hit)
			lwsl_err("%s: %p is not in vhost '%s' protocols list\n",
				 __func__, p, wsi->vhost->name);
	}

	if (wsi->protocol->callback(wsi, wsi->role_ops->protocol_bind_cb[
				    !!lwsi_role_server(wsi)],
				    wsi->user_space, NULL, 0))
		return 1;

	wsi->protocol_bind_balance = 1;

	return 0;
}